

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBaf.c
# Opt level: O3

Abc_Ntk_t * Io_ReadBaf(char *pFileName,int fCheck)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint nItemsTotal;
  uint uVar5;
  FILE *__stream;
  char *__ptr;
  Abc_Ntk_t *pNtk;
  uint *__ptr_00;
  undefined8 *puVar6;
  Abc_Obj_t *pAVar7;
  void *pvVar8;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pObj_00;
  ProgressBar *p;
  Vec_Ptr_t *pVVar9;
  uint uVar10;
  size_t __size;
  char *__nptr;
  uint uVar11;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  uint *local_78;
  
  iVar2 = Extra_FileSize(pFileName);
  __stream = fopen(pFileName,"rb");
  __size = (size_t)iVar2;
  __ptr = (char *)malloc(__size);
  fread(__ptr,__size,1,__stream);
  fclose(__stream);
  cVar1 = *__ptr;
  pcVar12 = __ptr;
  while (__nptr = pcVar12, cVar1 == '#') {
    pcVar12 = pcVar12 + 1;
    do {
      cVar1 = *pcVar12;
      pcVar12 = pcVar12 + 1;
    } while (cVar1 != '\n');
    cVar1 = *pcVar12;
  }
  while (__nptr = __nptr + 1, cVar1 != '\0') {
    cVar1 = *__nptr;
  }
  iVar2 = atoi(__nptr);
  do {
    cVar1 = *__nptr;
    __nptr = __nptr + 1;
  } while (cVar1 != '\0');
  iVar3 = atoi(__nptr);
  do {
    cVar1 = *__nptr;
    __nptr = __nptr + 1;
  } while (cVar1 != '\0');
  iVar4 = atoi(__nptr);
  do {
    cVar1 = *__nptr;
    __nptr = __nptr + 1;
  } while (cVar1 != '\0');
  nItemsTotal = atoi(__nptr);
  do {
    cVar1 = *__nptr;
    __nptr = __nptr + 1;
  } while (cVar1 != '\0');
  pNtk = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  pcVar12 = Extra_UtilStrsav(pcVar12);
  pNtk->pName = pcVar12;
  pcVar12 = Extra_UtilStrsav(pFileName);
  pNtk->pSpec = pcVar12;
  __ptr_00 = (uint *)malloc(0x10);
  uVar11 = 8;
  if (6 < iVar4 + iVar2 + nItemsTotal) {
    uVar11 = nItemsTotal + iVar4 + iVar2 + 1;
  }
  *__ptr_00 = uVar11;
  if (uVar11 == 0) {
    pAVar7 = Abc_AigConst1(pNtk);
    puVar6 = (undefined8 *)malloc(0x80);
    *(undefined8 **)(__ptr_00 + 2) = puVar6;
    *__ptr_00 = 0x10;
  }
  else {
    puVar6 = (undefined8 *)malloc((long)(int)uVar11 << 3);
    *(undefined8 **)(__ptr_00 + 2) = puVar6;
    pAVar7 = Abc_AigConst1(pNtk);
  }
  local_78 = __ptr_00 + 2;
  __ptr_00[1] = 1;
  *puVar6 = pAVar7;
  if (0 < iVar2) {
    iVar15 = 0;
    do {
      pAVar7 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
      Abc_ObjAssignName(pAVar7,__nptr,(char *)0x0);
      do {
        cVar1 = *__nptr;
        __nptr = __nptr + 1;
      } while (cVar1 != '\0');
      uVar11 = __ptr_00[1];
      if (uVar11 == *__ptr_00) {
        if ((int)uVar11 < 0x10) {
          if (*(void **)local_78 == (void *)0x0) {
            pvVar8 = malloc(0x80);
          }
          else {
            pvVar8 = realloc(*(void **)local_78,0x80);
          }
          *(void **)(__ptr_00 + 2) = pvVar8;
          *__ptr_00 = 0x10;
        }
        else {
          if (*(void **)local_78 == (void *)0x0) {
            pvVar8 = malloc((ulong)uVar11 << 4);
          }
          else {
            pvVar8 = realloc(*(void **)local_78,(ulong)uVar11 << 4);
          }
          *(void **)(__ptr_00 + 2) = pvVar8;
          *__ptr_00 = uVar11 * 2;
        }
      }
      else {
        pvVar8 = *(void **)local_78;
      }
      __ptr_00[1] = uVar11 + 1;
      *(Abc_Obj_t **)((long)pvVar8 + (long)(int)uVar11 * 8) = pAVar7;
      iVar15 = iVar15 + 1;
    } while (iVar15 != iVar2);
  }
  if (0 < iVar3) {
    iVar2 = 0;
    do {
      pAVar7 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
      Abc_ObjAssignName(pAVar7,__nptr,(char *)0x0);
      do {
        cVar1 = *__nptr;
        __nptr = __nptr + 1;
      } while (cVar1 != '\0');
      iVar2 = iVar2 + 1;
    } while (iVar2 != iVar3);
  }
  if (0 < iVar4) {
    iVar2 = 0;
    do {
      pAVar7 = Abc_NtkCreateObj(pNtk,ABC_OBJ_LATCH);
      Abc_ObjAssignName(pAVar7,__nptr,(char *)0x0);
      do {
        cVar1 = *__nptr;
        __nptr = __nptr + 1;
      } while (cVar1 != '\0');
      pObj = Abc_NtkCreateObj(pNtk,ABC_OBJ_BI);
      Abc_ObjAssignName(pObj,__nptr,(char *)0x0);
      do {
        cVar1 = *__nptr;
        __nptr = __nptr + 1;
      } while (cVar1 != '\0');
      pObj_00 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BO);
      Abc_ObjAssignName(pObj_00,__nptr,(char *)0x0);
      do {
        cVar1 = *__nptr;
        __nptr = __nptr + 1;
      } while (cVar1 != '\0');
      uVar11 = __ptr_00[1];
      if (uVar11 == *__ptr_00) {
        if ((int)uVar11 < 0x10) {
          if (*(void **)local_78 == (void *)0x0) {
            pvVar8 = malloc(0x80);
          }
          else {
            pvVar8 = realloc(*(void **)local_78,0x80);
          }
          *(void **)(__ptr_00 + 2) = pvVar8;
          *__ptr_00 = 0x10;
        }
        else {
          if (*(void **)local_78 == (void *)0x0) {
            pvVar8 = malloc((ulong)uVar11 << 4);
          }
          else {
            pvVar8 = realloc(*(void **)local_78,(ulong)uVar11 << 4);
          }
          *(void **)(__ptr_00 + 2) = pvVar8;
          *__ptr_00 = uVar11 * 2;
        }
      }
      else {
        pvVar8 = *(void **)local_78;
      }
      __ptr_00[1] = uVar11 + 1;
      *(Abc_Obj_t **)((long)pvVar8 + (long)(int)uVar11 * 8) = pObj_00;
      Abc_ObjAddFanin(pAVar7,pObj);
      Abc_ObjAddFanin(pObj_00,pAVar7);
      iVar2 = iVar2 + 1;
    } while (iVar2 != iVar4);
  }
  lVar16 = __size + (long)(int)(iVar4 + iVar3 + nItemsTotal * 2) * -4;
  if (__ptr + lVar16 == __nptr) {
    p = Extra_ProgressBarStart(_stdout,nItemsTotal);
    if (0 < (int)nItemsTotal) {
      uVar13 = 0;
      do {
        if ((p == (ProgressBar *)0x0) || ((long)p->nItemsNext <= (long)uVar13)) {
          Extra_ProgressBarUpdate_int(p,(int)uVar13,(char *)0x0);
        }
        uVar5 = *(uint *)(__ptr + uVar13 * 8 + lVar16) >> 1;
        uVar11 = __ptr_00[1];
        if ((int)uVar11 <= (int)uVar5) goto LAB_002d3903;
        uVar10 = *(uint *)(__ptr + uVar13 * 8 + lVar16 + 4) >> 1;
        if (uVar11 <= uVar10) goto LAB_002d3903;
        pvVar8 = *(void **)local_78;
        pAVar7 = Abc_AigAnd((Abc_Aig_t *)pNtk->pManFunc,
                            (Abc_Obj_t *)
                            ((ulong)(*(uint *)(__ptr + uVar13 * 8 + lVar16) & 1) ^
                            *(ulong *)((long)pvVar8 + (ulong)uVar5 * 8)),
                            (Abc_Obj_t *)
                            ((ulong)(*(uint *)(__ptr + uVar13 * 8 + lVar16 + 4) & 1) ^
                            *(ulong *)((long)pvVar8 + (ulong)uVar10 * 8)));
        if (uVar11 == *__ptr_00) {
          if (uVar11 < 0x10) {
            pvVar8 = realloc(pvVar8,0x80);
            uVar5 = 0x10;
          }
          else {
            uVar5 = uVar11 * 2;
            pvVar8 = realloc(pvVar8,(ulong)uVar11 << 4);
          }
          *(void **)(__ptr_00 + 2) = pvVar8;
          *__ptr_00 = uVar5;
        }
        __ptr_00[1] = uVar11 + 1;
        *(Abc_Obj_t **)((long)pvVar8 + (ulong)uVar11 * 8) = pAVar7;
        uVar13 = uVar13 + 1;
      } while (nItemsTotal != uVar13);
    }
    Extra_ProgressBarStop(p);
    pVVar9 = pNtk->vCos;
    if (0 < pVVar9->nSize) {
      lVar14 = 0;
      do {
        pAVar7 = (Abc_Obj_t *)pVVar9->pArray[lVar14];
        uVar11 = *(uint *)(__ptr + lVar16 + lVar14 * 4 + (long)(int)(nItemsTotal * 2) * 4);
        if ((0 < (pAVar7->vFanouts).nSize) &&
           (pvVar8 = pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanouts).pArray],
           (*(uint *)((long)pvVar8 + 0x14) & 0xf) == 8)) {
          *(ulong *)((long)pvVar8 + 0x38) = (ulong)(uVar11 & 3);
          uVar11 = (int)uVar11 >> 2;
        }
        uVar5 = (int)uVar11 >> 1;
        if (((int)uVar5 < 0) || ((int)__ptr_00[1] <= (int)uVar5)) {
LAB_002d3903:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        Abc_ObjAddFanin(pAVar7,(Abc_Obj_t *)
                               ((ulong)(uVar11 & 1) ^
                               *(ulong *)(*(long *)local_78 + (ulong)uVar5 * 8)));
        lVar14 = lVar14 + 1;
        pVVar9 = pNtk->vCos;
      } while (lVar14 < pVVar9->nSize);
    }
    free(__ptr);
    if (*(void **)local_78 != (void *)0x0) {
      free(*(void **)local_78);
    }
    free(__ptr_00);
    if (fCheck == 0) {
      return pNtk;
    }
    iVar2 = Abc_NtkCheckRead(pNtk);
    if (iVar2 != 0) {
      return pNtk;
    }
    puts("Io_ReadBaf: The network check has failed.");
    Abc_NtkDelete(pNtk);
  }
  else {
    free(__ptr);
    if (*(void **)local_78 != (void *)0x0) {
      free(*(void **)local_78);
    }
    free(__ptr_00);
    Abc_NtkDelete(pNtk);
    puts("Warning: Internal reader error.");
  }
  return (Abc_Ntk_t *)0x0;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Reads the AIG in the binary format.]

  Description []
  
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Ntk_t * Io_ReadBaf( char * pFileName, int fCheck )
{
    ProgressBar * pProgress;
    FILE * pFile;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pNode0, * pNode1;
    Abc_Ntk_t * pNtkNew;
    int nInputs, nOutputs, nLatches, nAnds, nFileSize, Num, i;
    char * pContents, * pName, * pCur;
    unsigned * pBufferNode;
    int RetValue;

    // read the file into the buffer
    nFileSize = Extra_FileSize( pFileName );
    pFile = fopen( pFileName, "rb" );
    pContents = ABC_ALLOC( char, nFileSize );
    RetValue = fread( pContents, nFileSize, 1, pFile );
    fclose( pFile );

    // skip the comments (comment lines begin with '#' and end with '\n')
    for ( pCur = pContents; *pCur == '#'; )
        while ( *pCur++ != '\n' );

    // read the name
    pName = pCur;             while ( *pCur++ );
    // read the number of inputs
    nInputs = atoi( pCur );   while ( *pCur++ );
    // read the number of outputs
    nOutputs = atoi( pCur );  while ( *pCur++ );
    // read the number of latches
    nLatches = atoi( pCur );  while ( *pCur++ );
    // read the number of nodes
    nAnds = atoi( pCur );     while ( *pCur++ );

    // allocate the empty AIG
    pNtkNew = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pNtkNew->pName = Extra_UtilStrsav( pName );
    pNtkNew->pSpec = Extra_UtilStrsav( pFileName );

    // prepare the array of nodes
    vNodes = Vec_PtrAlloc( 1 + nInputs + nLatches + nAnds );
    Vec_PtrPush( vNodes, Abc_AigConst1(pNtkNew) );

    // create the PIs
    for ( i = 0; i < nInputs; i++ )
    {
        pObj = Abc_NtkCreatePi(pNtkNew);    
        Abc_ObjAssignName( pObj, pCur, NULL );  while ( *pCur++ );
        Vec_PtrPush( vNodes, pObj );
    }
    // create the POs
    for ( i = 0; i < nOutputs; i++ )
    {
        pObj = Abc_NtkCreatePo(pNtkNew);   
        Abc_ObjAssignName( pObj, pCur, NULL );  while ( *pCur++ ); 
    }
    // create the latches
    for ( i = 0; i < nLatches; i++ )
    {
        pObj = Abc_NtkCreateLatch(pNtkNew);
        Abc_ObjAssignName( pObj, pCur, NULL );  while ( *pCur++ ); 

        pNode0 = Abc_NtkCreateBi(pNtkNew);
        Abc_ObjAssignName( pNode0, pCur, NULL );  while ( *pCur++ ); 

        pNode1 = Abc_NtkCreateBo(pNtkNew);
        Abc_ObjAssignName( pNode1, pCur, NULL );  while ( *pCur++ ); 
        Vec_PtrPush( vNodes, pNode1 );

        Abc_ObjAddFanin( pObj, pNode0 );
        Abc_ObjAddFanin( pNode1, pObj );
    }

    // get the pointer to the beginning of the node array
    pBufferNode = (unsigned *)(pContents + (nFileSize - (2 * nAnds + nOutputs + nLatches) * sizeof(int)) );
    // make sure we are at the place where the nodes begin
    if ( pBufferNode != (unsigned *)pCur )
    {
        ABC_FREE( pContents );
        Vec_PtrFree( vNodes );
        Abc_NtkDelete( pNtkNew );
        printf( "Warning: Internal reader error.\n" );
        return NULL;
    }

    // create the AND gates
    pProgress = Extra_ProgressBarStart( stdout, nAnds );
    for ( i = 0; i < nAnds; i++ )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        pNode0 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, pBufferNode[2*i+0] >> 1), pBufferNode[2*i+0] & 1 );
        pNode1 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, pBufferNode[2*i+1] >> 1), pBufferNode[2*i+1] & 1 );
        Vec_PtrPush( vNodes, Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc, pNode0, pNode1) );
    }
    Extra_ProgressBarStop( pProgress );

    // read the POs
    Abc_NtkForEachCo( pNtkNew, pObj, i )
    {
        Num = pBufferNode[2*nAnds+i];
        if ( Abc_ObjFanoutNum(pObj) > 0 && Abc_ObjIsLatch(Abc_ObjFanout0(pObj)) )
        {
            Abc_ObjSetData( Abc_ObjFanout0(pObj), (void *)(ABC_PTRINT_T)(Num & 3) );
            Num >>= 2;
        }
        pNode0 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, Num >> 1), Num & 1 );
        Abc_ObjAddFanin( pObj, pNode0 );
    }
    ABC_FREE( pContents );
    Vec_PtrFree( vNodes );

    // remove the extra nodes
//    Abc_AigCleanup( (Abc_Aig_t *)pNtkNew->pManFunc );

    // check the result
    if ( fCheck && !Abc_NtkCheckRead( pNtkNew ) )
    {
        printf( "Io_ReadBaf: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;

}